

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-getsockname.c
# Opt level: O1

void pipe_client_connect_cb(uv_connect_t *req,int status)

{
  int iVar1;
  undefined8 uVar2;
  size_t unaff_RBX;
  size_t sVar3;
  char *pcVar4;
  char *unaff_R14;
  char *unaff_R15;
  int64_t eval_b_1;
  int64_t eval_b;
  undefined7 uStack_440;
  undefined4 uStack_439;
  size_t len;
  int64_t eval_b_3;
  char buf [1024];
  
  if (req == &connect_req) {
    buf._0_8_ = SEXT48(status);
    eval_b = 0;
    if (buf._0_8_ != 0) goto LAB_001aea84;
    len = 0x400;
    unaff_R14 = buf;
    iVar1 = uv_pipe_getpeername(&pipe_client,unaff_R14,&len);
    sVar3 = len;
    eval_b = (int64_t)iVar1;
    if (eval_b != 0) goto LAB_001aea93;
    if (buf[0] != '\0') {
      eval_b = 0;
      unaff_RBX = len;
      if (unaff_R14[len - 1] != '\0') {
        unaff_R15 = "/tmp/uv-test-sock";
        unaff_R14 = buf;
        iVar1 = bcmp(unaff_R14,"/tmp/uv-test-sock",len);
        if (iVar1 != 0) {
          pcVar4 = "\"/tmp/uv-test-sock\"";
          uVar2 = 0x43;
          goto LAB_001aeaf7;
        }
LAB_001aea1e:
        unaff_R14 = buf;
        len = 0x400;
        iVar1 = uv_pipe_getsockname(&pipe_client,buf,&len);
        unaff_RBX = sVar3;
        if ((iVar1 == 0) && (len == 0)) {
          pipe_client_connect_cb_called = pipe_client_connect_cb_called + 1;
          uv_close((uv_handle_t *)&pipe_client,pipe_close_cb);
          uv_close((uv_handle_t *)&pipe_server,pipe_close_cb);
          return;
        }
        goto LAB_001aeaa2;
      }
      goto LAB_001aeaa7;
    }
    eval_b._0_1_ = '\0';
    eval_b._1_1_ = '/';
    eval_b._2_1_ = 't';
    eval_b._3_1_ = 'm';
    eval_b._4_1_ = 'p';
    eval_b._5_1_ = '/';
    eval_b._6_1_ = 'u';
    eval_b._7_1_ = 'v';
    uStack_440 = 0x732d747365742d;
    uStack_439 = 0x6b636f;
    eval_b_3 = 0x12;
    if (len != 0x12) goto LAB_001aeab6;
    unaff_R14 = buf;
    unaff_R15 = (char *)&eval_b;
    iVar1 = bcmp(unaff_R14,unaff_R15,0x12);
    if (iVar1 == 0) goto LAB_001aea1e;
  }
  else {
    pipe_client_connect_cb_cold_1();
LAB_001aea84:
    pipe_client_connect_cb_cold_2();
LAB_001aea93:
    pipe_client_connect_cb_cold_3();
LAB_001aeaa2:
    pipe_client_connect_cb_cold_6();
LAB_001aeaa7:
    pipe_client_connect_cb_cold_4();
    sVar3 = unaff_RBX;
LAB_001aeab6:
    pipe_client_connect_cb_cold_5();
  }
  pcVar4 = "expected";
  uVar2 = 0x40;
LAB_001aeaf7:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%.*s %s %.*s)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-getsockname.c"
          ,uVar2,"buf","==",pcVar4,sVar3,unaff_R14,"==",sVar3,unaff_R15);
  abort();
}

Assistant:

static void pipe_client_connect_cb(uv_connect_t* req, int status) {
  char buf[1024];
  size_t len;
  int r;

  ASSERT_PTR_EQ(req, &connect_req);
  ASSERT_OK(status);

  len = sizeof buf;
  r = uv_pipe_getpeername(&pipe_client, buf, &len);
  ASSERT_OK(r);

  if (*buf == '\0') {  /* Linux abstract socket. */
    const char expected[] = "\0" TEST_PIPENAME;
    ASSERT_EQ(len, sizeof(expected) - 1);
    ASSERT_MEM_EQ(buf, expected, len);
  } else {
    ASSERT_NE(0, buf[len - 1]);
    ASSERT_MEM_EQ(buf, TEST_PIPENAME, len);
  }

  len = sizeof buf;
  r = uv_pipe_getsockname(&pipe_client, buf, &len);
  ASSERT(r == 0 && len == 0);

  pipe_client_connect_cb_called++;

  uv_close((uv_handle_t*) &pipe_client, pipe_close_cb);
  uv_close((uv_handle_t*) &pipe_server, pipe_close_cb);
}